

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O1

void __thiscall
Executor::assertValueType(Executor *this,Value *value,TypeName *type,string *activity,Node *node)

{
  long *plVar1;
  mapped_type *__rhs;
  size_type *psVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (value->valueType_ == *type) {
    return;
  }
  std::operator+(&local_38,"Cannot perform ",activity);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_38);
  local_98._M_dataplus._M_p = (pointer)*plVar1;
  psVar2 = (size_type *)(plVar1 + 2);
  if ((size_type *)local_98._M_dataplus._M_p == psVar2) {
    local_98.field_2._M_allocated_capacity = *psVar2;
    local_98.field_2._8_8_ = plVar1[3];
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  }
  else {
    local_98.field_2._M_allocated_capacity = *psVar2;
  }
  local_98._M_string_length = plVar1[1];
  *plVar1 = (long)psVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  __rhs = std::__detail::
          _Map_base<TypeName,_std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<TypeName>,_std::hash<TypeName>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
          ::at((_Map_base<TypeName,_std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<TypeName>,_std::hash<TypeName>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)&TypeNameStrings_abi_cxx11_,&value->valueType_);
  std::operator+(&local_58,&local_98,__rhs);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_58);
  local_78._M_dataplus._M_p = (pointer)*plVar1;
  psVar2 = (size_type *)(plVar1 + 2);
  if ((size_type *)local_78._M_dataplus._M_p == psVar2) {
    local_78.field_2._M_allocated_capacity = *psVar2;
    local_78.field_2._8_8_ = plVar1[3];
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  }
  else {
    local_78.field_2._M_allocated_capacity = *psVar2;
  }
  local_78._M_string_length = plVar1[1];
  *plVar1 = (long)psVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  reportError(&local_78,node);
}

Assistant:

void Executor::assertValueType(const Value& value, const TypeName& type, const std::string& activity, const Node& node) const
{
  if(value.getType() != type)
    reportError("Cannot perform " + activity +
      " with value of type " + TypeNameStrings.at(value.getType()) + "!", node);
}